

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O0

void draw_rich_text_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  ostream *poVar5;
  Am_Text_Viewing_Context local_58;
  Am_Text_Viewing_Context vc;
  undefined1 local_40 [8];
  Am_Value value;
  int height;
  int width;
  int top;
  int left;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *drawonable_local;
  Am_Object *self_local;
  
  pAVar4 = Am_Object::Get(self,100,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(self,0x65,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(self,0x66,0);
  value.value.long_value._4_4_ = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(self,0x67,0);
  value.value.float_value = (float)Am_Value::operator_cast_to_int(pAVar4);
  Am_Value::Am_Value((Am_Value *)local_40);
  Am_Object::Make_Unique(self,0x1ee);
  pAVar4 = Am_Object::Peek(self,0x1ee,0);
  Am_Value::operator=((Am_Value *)local_40,pAVar4);
  bVar1 = Am_Text_Viewing_Context::Test((Am_Value *)local_40);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar5 = std::operator<<(poVar5,
                             "The slot Am_TEXT_VIEWER does not contain an Am_Text_Viewing_Context.")
    ;
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  Am_Text_Viewing_Context::Am_Text_Viewing_Context(&local_58,(Am_Value *)local_40);
  bVar1 = Am_Text_Viewing_Context::Valid(&local_58);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar5 = std::operator<<(poVar5,"Tried to draw an invalid Am_Text_Viewing_Context.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  (*drawonable->_vptr_Am_Drawonable[0x21])
            (drawonable,(ulong)(uint)(x_offset + iVar2),(ulong)(uint)(y_offset + iVar3),
             (ulong)(uint)value.value.long_value._4_4_,(ulong)(uint)value.value.float_value);
  Am_Text_Viewing_Context::Draw
            (&local_58,drawonable,(long)(x_offset + iVar2),(long)(y_offset + iVar3));
  (*drawonable->_vptr_Am_Drawonable[0x22])();
  Am_Text_Viewing_Context::~Am_Text_Viewing_Context(&local_58);
  Am_Value::~Am_Value((Am_Value *)local_40);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, draw_rich_text,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = self.Get(Am_LEFT);
  int top = self.Get(Am_TOP);
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);

  Am_Value value;
  self.Make_Unique(Am_TEXT_VIEWER);
  value = self.Peek(Am_TEXT_VIEWER);

  if (!Am_Text_Viewing_Context::Test(value))
    Am_ERRORO(
        "The slot Am_TEXT_VIEWER does not contain an Am_Text_Viewing_Context.",
        self, Am_TEXT_VIEWER);

  Am_Text_Viewing_Context vc = value;
  if (vc.Valid()) {
    drawonable->Push_Clip(x_offset + left, y_offset + top, width, height);
    vc.Draw(drawonable, x_offset + left, y_offset + top);
    drawonable->Pop_Clip();
  } else
    Am_ERRORO("Tried to draw an invalid Am_Text_Viewing_Context.", self,
              Am_TEXT_VIEWER);
}